

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<int>::emplace<int&>(QPodArrayOps<int> *this,qsizetype i,int *args)

{
  int iVar1;
  Data *pDVar2;
  long lVar3;
  int *piVar4;
  GrowthPosition where;
  
  pDVar2 = (this->super_QArrayDataPointer<int>).d;
  if ((pDVar2 != (Data *)0x0) &&
     ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    lVar3 = (this->super_QArrayDataPointer<int>).size;
    if ((lVar3 == i) &&
       (piVar4 = (this->super_QArrayDataPointer<int>).ptr,
       (pDVar2->super_QArrayData).alloc !=
       ((long)((long)piVar4 -
              ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 2) +
       i)) {
      piVar4[i] = *args;
      (this->super_QArrayDataPointer<int>).size = i + 1;
      return;
    }
    if ((i == 0) &&
       (piVar4 = (this->super_QArrayDataPointer<int>).ptr,
       (int *)((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) != piVar4
       )) {
      piVar4[-1] = *args;
      (this->super_QArrayDataPointer<int>).ptr = piVar4 + -1;
      (this->super_QArrayDataPointer<int>).size = lVar3 + 1;
      return;
    }
  }
  iVar1 = *args;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<int>).size != 0);
  QArrayDataPointer<int>::detachAndGrow
            (&this->super_QArrayDataPointer<int>,where,1,(int **)0x0,(QArrayDataPointer<int> *)0x0);
  piVar4 = createHole(this,where,i,1);
  *piVar4 = iVar1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }